

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O3

void __thiscall
wigwag::detail::
listenable_impl<std::function<void(CollectionOp,int_const&,std::__cxx11::string_const&)>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
::handler_node_with_attributes::
handler_node_with_attributes<wigwag::detail::intrusive_ptr<wigwag::detail::listenable_impl<std::function<void(CollectionOp,int_const&,std::__cxx11::string_const&)>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>>&,std::function<void(CollectionOp,int_const&,std::__cxx11::string_const&)>>
          (handler_node_with_attributes *this,handler_attributes attributes,
          intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
          *args,function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *args_1)

{
  intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  *piVar1;
  _Manager_type p_Var2;
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  local_40;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  local_40 = (intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
              )args->_raw;
  if (local_40._raw !=
      (listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
       *)0x0) {
    LOCK();
    ((local_40._raw)->
    super_intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
    ).super_atomic._counter.super___atomic_base<int>._M_i =
         ((local_40._raw)->
         super_intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
         ).super_atomic._counter.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = args_1->_M_invoker;
  p_Var2 = (args_1->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(args_1->super__Function_base)._M_functor
    ;
    local_38._8_8_ = *(undefined8 *)((long)&(args_1->super__Function_base)._M_functor + 8);
    (args_1->super__Function_base)._M_manager = (_Manager_type)0x0;
    args_1->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var2;
  }
  listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  ::handler_node::handler_node((handler_node *)this,&local_40,(handler_type *)&local_38);
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_40._raw !=
      (listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
       *)0x0) {
    LOCK();
    piVar1 = &(local_40._raw)->
              super_intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
    ;
    (piVar1->super_atomic)._counter.super___atomic_base<int>._M_i =
         (piVar1->super_atomic)._counter.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((piVar1->super_atomic)._counter.super___atomic_base<int>._M_i == 0) {
      (*(local_40._raw)->_vptr_listenable_impl[1])();
    }
  }
  *(undefined ***)this = &PTR_release_token_impl_0011f9d8;
  *(undefined ***)(this + 8) = &PTR__handler_node_with_attributes_0011fa08;
  *(handler_attributes *)(this + 0x50) = attributes;
  return;
}

Assistant:

handler_node_with_attributes(handler_attributes attributes, Args_&&... args)
                : handler_node(std::forward<Args_>(args)...), _attributes(attributes)
            { }